

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

QString * QDir::toNativeSeparators(QString *pathName)

{
  Data *pDVar1;
  QString *in_RDI;
  
  pDVar1 = (pathName->d).d;
  (in_RDI->d).d = pDVar1;
  (in_RDI->d).ptr = (pathName->d).ptr;
  (in_RDI->d).size = (pathName->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return in_RDI;
}

Assistant:

QString QDir::toNativeSeparators(const QString &pathName)
{
#if defined(Q_OS_WIN)
    qsizetype i = pathName.indexOf(u'/');
    if (i != -1) {
        QString n(pathName);

        QChar * const data = n.data();
        data[i++] = u'\\';

        for (; i < n.length(); ++i) {
            if (data[i] == u'/')
                data[i] = u'\\';
        }

        return n;
    }
#endif
    return pathName;
}